

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O1

const_iterator * __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::find<pstore::uint128,void>
          (const_iterator *__return_storage_ptr__,
          hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
          *this,database *db,uint128 *key)

{
  parent_stack *__s;
  ulong uVar1;
  internal_node *piVar2;
  bool bVar3;
  index_pointer iVar4;
  key_type *pkVar5;
  long lVar6;
  address addr;
  long extraout_RDX;
  uint uVar7;
  unsigned_long uVar8;
  index_pointer node;
  ulong uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar10;
  parent_stack parents;
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  local_128;
  uint128 *local_110;
  index_pointer local_108;
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  ahStack_100 [200];
  ulong local_38;
  
  addr.a_ = (value_type)key;
  bVar3 = hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          ::empty((hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                   *)this);
  if (bVar3) {
    memset(&__return_storage_ptr__->visited_parents_,0,0xd8);
    __return_storage_ptr__->db_ = db;
    __return_storage_ptr__->index_ =
         (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          *)this;
    (__return_storage_ptr__->pos_)._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
    ._M_head_impl = (pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_> *)0x0;
  }
  else {
    uVar9 = *(ulong *)((long)&key->v_ + 8);
    node = *(index_pointer *)(this + 0x18);
    local_110 = key;
    memset(&local_108,0,0xd8);
    __s = &__return_storage_ptr__->visited_parents_;
    uVar7 = 0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      if (((ulong)node.internal_ & 1) == 0) {
        if (((ulong)node.internal_ & 2) != 0) {
          __assert_fail("is_address ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                        ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
        }
        pkVar5 = hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                 ::get_key((key_type *)this,
                           (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                            *)db,(database *)node.internal_,addr);
        if (extraout_RDX == *(long *)((long)&local_110->v_ + 8) &&
            pkVar5 == *(key_type **)&local_110->v_) {
          if (0xc < local_38) {
            assert_failed("elements_ < Size",
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                          ,100);
          }
          lVar6 = local_38 * 0x10;
          *(index_pointer *)(ahStack_100 + lVar6 + -8) = node;
          local_38 = local_38 + 1;
          *(undefined8 *)(ahStack_100 + lVar6) = 0xffffffffffffffff;
          __return_storage_ptr__->db_ = db;
          memcpy(__s,&local_108,0xd8);
        }
        else {
          memset(__s,0,0xd8);
          __return_storage_ptr__->db_ = db;
        }
        __return_storage_ptr__->index_ =
             (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
              *)this;
        (__return_storage_ptr__->pos_)._M_t.
        super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
        .
        super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
        ._M_head_impl =
             (pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_> *)0x0;
        this_01._M_pi = this_00;
        break;
      }
      if (uVar7 < 0x42) {
        details::internal_node::get_node(&local_128,db,node);
        this_01._M_pi =
             local_128.first.
             super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        local_128.first.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_128.first.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        piVar2 = local_128.second;
        if (local_128.first.
            super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_128.first.
                     super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        uVar1 = piVar2->bitmap_;
        if ((uVar1 >> (uVar9 & 0x3f) & 1) == 0) {
          uVar8 = 0xffffffffffffffff;
          iVar4.internal_ = (internal_node *)0x0;
        }
        else {
          uVar8 = POPCOUNT(uVar1 & (1L << ((byte)uVar9 & 0x3f)) - 1U);
          iVar4 = (index_pointer)piVar2->children_[uVar8].internal_;
        }
        pVar10.second = uVar8;
        pVar10.first.internal_ = iVar4.internal_;
      }
      else {
        details::linear_node::get_node
                  ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                    *)&local_128,db,node);
        this_01._M_pi =
             local_128.first.
             super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        local_128.first.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_128.first.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        piVar2 = local_128.second;
        if (local_128.first.
            super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_128.first.
                     super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        pVar10 = details::linear_node::
                 lookup<pstore::uint128,pstore::uint128,std::equal_to<pstore::uint128>,void>
                           ((linear_node *)piVar2,db,local_110);
      }
      uVar8 = pVar10.second;
      if (uVar8 == 0xffffffffffffffff) {
        memset(__s,0,0xd8);
        __return_storage_ptr__->db_ = db;
        __return_storage_ptr__->index_ =
             (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
              *)this;
        (__return_storage_ptr__->pos_)._M_t.
        super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
        .
        super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
        ._M_head_impl =
             (pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_> *)0x0;
        addr.a_ = (value_type)this;
      }
      else {
        if (0xc < local_38) {
          assert_failed("elements_ < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                        ,100);
        }
        addr.a_ = local_38 * 0x10;
        (&local_108)[local_38 * 2] = node;
        lVar6 = local_38 * 0x10;
        local_38 = local_38 + 1;
        *(unsigned_long *)(ahStack_100 + lVar6) = uVar8;
        uVar7 = uVar7 + 6;
        uVar9 = uVar9 >> 6;
        node = pVar10.first;
      }
      this_00 = this_01._M_pi;
    } while (uVar8 != 0xffffffffffffffff);
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::find (database const & db,
                                                                 OtherKeyType const & key) const
            -> const_iterator {
            if (empty ()) {
                return this->cend (db);
            }

            auto hash = static_cast<hash_type> (hash_ (key));
            unsigned bit_shifts = 0;
            index_pointer node = root_;
            parent_stack parents;

            std::shared_ptr<void const> store_node;
            while (!node.is_leaf ()) {
                index_pointer child_node;
                auto index = std::size_t{0};

                if (details::depth_is_internal_node (bit_shifts)) {
                    // It's an internal node.
                    internal_node const * internal = nullptr;
                    std::tie (store_node, internal) = internal_node::get_node (db, node);
                    std::tie (child_node, index) =
                        internal->lookup (hash & details::hash_index_mask);
                } else {
                    // It's a linear node.
                    linear_node const * linear = nullptr;
                    std::tie (store_node, linear) = linear_node::get_node (db, node);
                    std::tie (child_node, index) = linear->lookup<KeyType> (db, key, equal_);
                }

                if (index == details::not_found) {
                    return this->cend (db);
                }
                parents.push (details::parent_type{node, index});

                // Go to next sub-trie level
                node = child_node;
                bit_shifts += details::hash_index_bits;
                hash >>= details::hash_index_bits;
            }
            // It's a leaf node.
            PSTORE_ASSERT (node.is_leaf ());
            key_type const existing_key = get_key (db, node.to_address ());
            if (equal_ (existing_key, key)) {
                parents.push (details::parent_type{node});
                return const_iterator (db, std::move (parents), this);
            }
            return this->cend (db);
        }